

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotPieChart<double>
               (char **label_ids,double *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  ImU32 col;
  double dVar1;
  double dVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImPlotContext *pIVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  ImGuiID key;
  ulong uVar10;
  ImPlotItem *pIVar11;
  uint uVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar17;
  double dVar18;
  double dVar19;
  ImVec4 IVar20;
  ImPlotPoint center;
  char buffer [32];
  float local_e8;
  float fStack_e4;
  ImPlotPoint local_c8;
  undefined1 local_b8 [24];
  double local_a0;
  char *local_98;
  ImDrawList *local_90;
  double local_88;
  int local_7c;
  double *local_78;
  char **local_70;
  double local_68;
  ImVec2 local_60;
  char local_58 [40];
  
  local_98 = fmt;
  local_70 = label_ids;
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                  ,0x6b2,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = double]"
                 );
  }
  local_90 = GetPlotDrawList();
  uVar14 = (ulong)(uint)count;
  local_88 = 0.0;
  if (0 < count) {
    uVar10 = 0;
    local_88 = 0.0;
    do {
      local_88 = local_88 + values[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
  }
  bVar8 = 1.0 < local_88;
  local_c8.x = x;
  local_c8.y = y;
  PushPlotClipRect(0.0);
  if (0 < count) {
    bVar8 = normalize || bVar8;
    dVar18 = ((angle0 + angle0) * 3.1415927410125732) / 360.0;
    uVar10 = 0;
    uVar15 = SUB84(local_88,0);
    uVar16 = (undefined4)((ulong)local_88 >> 0x20);
    dVar19 = dVar18;
    local_7c = count;
    local_78 = values;
    do {
      dVar17 = values[uVar10];
      if (bVar8) {
        dVar17 = dVar17 / (double)CONCAT44(uVar16,uVar15);
      }
      local_a0 = dVar17 * 6.2831854820251465 + dVar19;
      bVar9 = BeginItem(local_70[uVar10],-1);
      if (bVar9) {
        col = GImPlot->CurrentItem->Color;
        if (0.5 <= dVar17) {
          dVar17 = local_a0 - dVar19;
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<double>();
          }
          dVar17 = dVar17 * 0.5 + dVar19;
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          uVar12 = (uint)((dVar17 - dVar19) * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          local_68 = (dVar17 - dVar19) / (double)(int)(uVar12 - 1);
          uVar13 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar13 * local_68 + dVar19;
            local_b8._0_8_ = dVar1;
            dVar1 = cos(dVar1);
            dVar7 = local_c8.y;
            dVar2 = sin((double)local_b8._0_8_);
            IVar3 = PlotToPixels(dVar1 * radius + dVar6,dVar7 + dVar2 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar13 * 8 + 8) = IVar3;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
          ImDrawList::AddConvexPolyFilled
                    (local_90,(ImVec2 *)
                              RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                              ::buffer,uVar12 + 1,col);
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<double>();
          }
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          dVar19 = local_a0 - dVar17;
          uVar12 = (uint)(dVar19 * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          uVar13 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar13 * (dVar19 / (double)(int)(uVar12 - 1)) + dVar17;
            dVar2 = cos(dVar1);
            local_b8._0_8_ = local_c8.y;
            dVar1 = sin(dVar1);
            IVar3 = PlotToPixels(dVar2 * radius + dVar6,(double)local_b8._0_8_ + dVar1 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar13 * 8 + 8) = IVar3;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        else {
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<double>();
          }
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          dVar17 = local_a0 - dVar19;
          uVar12 = (uint)(dVar17 * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          uVar13 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar13 * (dVar17 / (double)(int)(uVar12 - 1)) + dVar19;
            local_b8._0_8_ = dVar1;
            dVar1 = cos(dVar1);
            dVar7 = local_c8.y;
            dVar2 = sin((double)local_b8._0_8_);
            IVar3 = PlotToPixels(dVar1 * radius + dVar6,dVar7 + dVar2 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar13 * 8 + 8) = IVar3;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        ImDrawList::AddConvexPolyFilled
                  (local_90,(ImVec2 *)
                            RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                            ::buffer,uVar12 + 1,col);
        pIVar5 = GImPlot;
        PopPlotClipRect();
        ImPlotNextItemData::Reset(&pIVar5->NextItemData);
        pIVar5->PreviousItem = pIVar5->CurrentItem;
        pIVar5->CurrentItem = (ImPlotItem *)0x0;
        values = local_78;
      }
      uVar10 = uVar10 + 1;
      uVar15 = SUB84(local_88,0);
      uVar16 = (undefined4)((ulong)local_88 >> 0x20);
      dVar19 = local_a0;
    } while (uVar10 != uVar14);
    if ((local_98 != (char *)0x0) && (0 < local_7c)) {
      uVar10 = 0;
      do {
        pIVar5 = GImPlot;
        key = ImGui::GetID(local_70[uVar10]);
        pIVar11 = ImPool<ImPlotItem>::GetByKey(&pIVar5->CurrentPlot->Items,key);
        dVar19 = local_78[uVar10];
        if (bVar8) {
          dVar19 = dVar19 / local_88;
        }
        dVar19 = dVar19 * 6.2831854820251465 + dVar18;
        if (pIVar11->Show == true) {
          sprintf(local_58,local_98);
          IVar3 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
          dVar18 = (dVar19 - dVar18) * 0.5 + dVar18;
          local_b8._0_8_ = local_c8.x;
          dVar17 = cos(dVar18);
          dVar1 = local_c8.y;
          local_b8._0_8_ = dVar17 * radius * 0.5 + (double)local_b8._0_8_;
          dVar18 = sin(dVar18);
          IVar4 = PlotToPixels((double)local_b8._0_8_,dVar1 + dVar18 * radius * 0.5,-1);
          local_b8._8_4_ = extraout_XMM0_Dc;
          local_b8._0_4_ = IVar4.x;
          local_b8._4_4_ = IVar4.y;
          local_b8._12_4_ = extraout_XMM0_Dd;
          IVar20 = ImGui::ColorConvertU32ToFloat4(pIVar11->Color);
          local_e8 = IVar3.x;
          fStack_e4 = IVar3.y;
          local_60.y = fStack_e4 * -0.5 + (float)local_b8._4_4_;
          local_60.x = local_e8 * -0.5 + (float)local_b8._0_4_;
          ImDrawList::AddText(local_90,&local_60,
                              -(uint)(IVar20.z * 0.114 + IVar20.x * 0.299 + IVar20.y * 0.587 <= 0.5)
                              | 0xff000000,local_58,(char *)0x0);
        }
        uVar10 = uVar10 + 1;
        dVar18 = dVar19;
      } while (uVar14 != uVar10);
    }
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = GetCurrentItem()->Color;
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col  = CalcTextColor(ImGui::ColorConvertU32ToFloat4(item->Color));
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}